

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O0

bool __thiscall road_network::is_inner(road_network *this,node_type n)

{
  node_type n_local;
  road_network *this_local;
  
  switch(n) {
  case P0:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case P1:
    this_local._7_1_ = true;
    break;
  case P2:
    this_local._7_1_ = true;
    break;
  case P3:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool road_network::is_inner(node_type n)
{
    switch (n)
    {
        case node_type::P0:
            return true;
        case node_type::P1:
            return true;
        case node_type::P2:
            return true;
        case node_type::P3:
            return true;
        default:
            return false;
    }
}